

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH32_hash_t VELOCYPACK_XXH32_digest(XXH32_state_t *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  xxh_u32 xVar6;
  XXH_alignment in_ECX;
  int iVar7;
  long lVar8;
  undefined1 auVar9 [16];
  long lVar10;
  undefined8 uVar4;
  
  if (state->large_len == 0) {
    iVar7 = state->v3 + 0x165667b1;
  }
  else {
    uVar1 = state->v1;
    uVar2 = state->v2;
    uVar3 = state->v3;
    uVar5 = state->v4;
    uVar4 = CONCAT44(uVar5,uVar3);
    lVar8 = (uVar4 & 0xffffffff) * 0x1000;
    auVar9._8_4_ = 0x40000;
    auVar9._0_8_ = 0x8000000080;
    auVar9._12_4_ = 0x40000;
    lVar10 = (auVar9._8_8_ & 0xffffffff) * (ulong)(uint)uVar5;
    iVar7 = ((uint)lVar10 | (uint)((ulong)lVar10 >> 0x20)) +
            ((uint)((ulong)(uint)uVar2 * 0x80) | (uint)((ulong)(uint)uVar2 * 0x80 >> 0x20)) +
            ((uint)lVar8 | (uint)((ulong)lVar8 >> 0x20)) +
            ((uint)((ulong)(uint)uVar1 * 2) | (uint)((ulong)(uint)uVar1 * 2 >> 0x20));
  }
  xVar6 = XXH32_finalize(iVar7 + state->total_len_32,(xxh_u8 *)state->mem32,(ulong)state->memsize,
                         in_ECX);
  return xVar6;
}

Assistant:

XXH_PUBLIC_API XXH32_hash_t XXH32_digest(const XXH32_state_t* state) {
  xxh_u32 h32;

  if (state->large_len) {
    h32 = XXH_rotl32(state->v1, 1) + XXH_rotl32(state->v2, 7) +
          XXH_rotl32(state->v3, 12) + XXH_rotl32(state->v4, 18);
  } else {
    h32 = state->v3 /* == seed */ + XXH_PRIME32_5;
  }

  h32 += state->total_len_32;

  return XXH32_finalize(h32, (const xxh_u8*)state->mem32, state->memsize,
                        XXH_aligned);
}